

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

void __thiscall clask::server_t::_run(server_t *this,string *host,int port)

{
  int iVar1;
  runtime_error *prVar2;
  ulong uVar3;
  char *pcVar4;
  allocator<char> local_8d;
  sockopt_t local_8c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  type local_68;
  thread local_60;
  thread t;
  hostent *info;
  socklen_t local_3c [2];
  int addrlen;
  sockopt_t opt;
  sockaddr_in address;
  int s;
  int server_fd;
  int port_local;
  string *host_local;
  server_t *this_local;
  
  memset(&addrlen,0,0x10);
  local_3c[1] = 1;
  local_3c[0] = 0x10;
  sort_handlers(&this->treeGET);
  sort_handlers(&this->treePOST);
  address.sin_zero._4_4_ = socket(2,1,0);
  if ((int)address.sin_zero._4_4_ < 0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"socket failed");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = setsockopt(address.sin_zero._4_4_,1,2,local_3c + 1,4);
  if (iVar1 != 0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"setsockopt");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  addrlen._0_2_ = 2;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    t._M_id._M_thread = (id)gethostbyname(pcVar4);
    if (t._M_id._M_thread == 0) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"gethostbyname");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    opt = *(sockopt_t *)**(char ***)((long)t._M_id._M_thread + 0x18);
  }
  else {
    opt = htonl(0);
  }
  addrlen._2_2_ = htons((uint16_t)port);
  iVar1 = bind(address.sin_zero._4_4_,(sockaddr *)&addrlen,0x10);
  if (-1 < iVar1) {
    iVar1 = listen(address.sin_zero._4_4_,0x1000);
    if (-1 < iVar1) {
      while (address.sin_zero._0_4_ = accept(address.sin_zero._4_4_,(sockaddr *)&addrlen,local_3c),
            -1 < (int)address.sin_zero._0_4_) {
        local_8c = opt;
        local_68.this = this;
        pcVar4 = inet_ntoa((in_addr)opt);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,pcVar4,&local_8d);
        std::thread::
        thread<clask::server_t::_run(std::__cxx11::string_const&,int)::_lambda(int,std::__cxx11::string_const&)_1_,int&,std::__cxx11::string,void>
                  (&local_60,&local_68,(int *)address.sin_zero,&local_88);
        std::__cxx11::string::~string((string *)&local_88);
        std::allocator<char>::~allocator(&local_8d);
        std::thread::detach();
        std::thread::~thread(&local_60);
      }
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"accept");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"listen");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar2,"bind failed");
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void server_t::_run(const std::string& host, int port = 8080) {
  int server_fd, s;
  struct sockaddr_in address{};
  sockopt_t opt = 1;
  int addrlen = sizeof(address);

#ifdef _WIN32
  WSADATA wsa;
  (void) WSAStartup(MAKEWORD(2, 0), &wsa);
#endif

  sort_handlers(treeGET);
  sort_handlers(treePOST);

#if 0
  for (auto v : treeGET.children) {
    std::cout << v.name << std::endl;
    std::cout << v.placeholder << std::endl;
  }
#endif

  if ((server_fd = (int) socket(AF_INET, SOCK_STREAM, 0)) < 0) {
    throw std::runtime_error("socket failed");
  }

  if (setsockopt(server_fd, SOL_SOCKET, SO_REUSEADDR, &opt, (int) sizeof(opt))) {
    throw std::runtime_error("setsockopt");
  }
  address.sin_family = AF_INET;
  if (host.empty())
    address.sin_addr.s_addr = htonl(INADDR_ANY);
  else {
    auto info = gethostbyname(host.c_str());
    if (info == nullptr) {
      throw std::runtime_error("gethostbyname");
    }
    address.sin_addr = *(struct in_addr *)(info->h_addr_list[0]);
  }
  address.sin_port = htons((u_short) port);

  if (bind(server_fd, (struct sockaddr *)&address, sizeof(address)) < 0) {
    throw std::runtime_error("bind failed");
  }
  if (listen(server_fd, SOMAXCONN) < 0) {
    throw std::runtime_error("listen");
  }

  while (true) {
    if ((s = (int) accept(server_fd, (struct sockaddr *)&address, (socklen_t*)&addrlen))<0) {
      throw std::runtime_error("accept");
    }

    std::thread t([&](int s, const std::string& remote) {
retry:
      char buf[4096];
      const char *method, *path;
      int pret, minor_version;
      struct phr_header headers[100];
      size_t buflen = 0, prevbuflen = 0, method_len, path_len, num_headers;
      ssize_t rret;

      while (true) {
        while ((rret = recv(s, buf + buflen, (int) (sizeof(buf) - buflen), MSG_NOSIGNAL)) == -1 && errno == EINTR);
        if (rret <= 0) {
          // IOError
          closesocket(s);
          return;
        }

        prevbuflen = buflen;
        buflen += rret;
        num_headers = sizeof(headers) / sizeof(headers[0]);
        pret = phr_parse_request(
            buf, buflen, &method, &method_len, &path, &path_len,
            &minor_version, headers, &num_headers, prevbuflen);
        if (pret > 0) {
          break;
        }
        if (pret == -1) {
          // ParseError
#ifndef CLASK_DISABLE_LOGS
          logger().get(log_level::ERR) << "invalid request";
#endif
          return;
        }
        if (buflen == sizeof(buf)) {
          // RequestIsTooLongError
#ifndef CLASK_DISABLE_LOGS
          logger().get(log_level::ERR) << "request is too long";
#endif
          continue;
        }
      }

      const std::string req_method(method, method_len);
      std::string req_path(path, path_len);
      std::string req_body(buf + pret, buflen - pret);
      const std::string req_raw_path = req_path;
      std::unordered_map<std::string, std::string> req_uri_params;
      std::vector<header> req_headers;

      auto pos = req_path.find('?');
      if (pos != std::string::npos) {
        req_path.resize(pos);
        std::istringstream iss(req_raw_path.substr(pos + 1));
        std::string keyval, key, val;
        while (std::getline(iss, keyval, '&')) {
          std::istringstream isk(keyval);
          if(std::getline(std::getline(isk, key, '='), val)) {
            req_uri_params[url_decode(key)] = url_decode(val);
          }
        }
      }

      bool keep_alive = minor_version == 1;
      bool has_content_length = false;
      size_t content_length = 0;
      for (size_t n = 0; n < num_headers; n++) {
        auto key = std::string(headers[n].name, headers[n].name_len);
        auto val = std::string(headers[n].value, headers[n].value_len);
        camelize(key);
        if (key == "Content-Length") {
          content_length = std::stoi(val);
          has_content_length = true;
        } else if (key == "Connection") {
          for (auto& c : val) c = (char) std::tolower(c);
          if (val == "keep-alive")
            keep_alive = true;
          else if (val == "close")
            keep_alive = false;
        }
        req_headers.emplace_back(std::move(key), std::move(val));
      }

      if (has_content_length && buflen - pret < content_length) {
        auto rest = content_length - (buflen - pret);
        buflen = 0;
        while (rest > 0) {
          while ((rret = recv(s, buf + buflen, (int) (sizeof(buf) - buflen), MSG_NOSIGNAL)) == -1 && errno == EINTR);
          if (rret <= 0) {
            // IOError
            closesocket(s);
            return;
          }
          req_body.append(buf, rret);
          rest -= rret;
        }
      }

      request req(
          req_method,
          req_raw_path,
          req_path,
          std::move(req_uri_params),
          std::move(req_headers),
          std::move(req_body));

      if (!match(req_method, req_path, [&](const func_t& fn, const std::vector<std::string>& args) {
        req.args = args;
        int code = 500;
        try {
          code = fn.handle(s, req, keep_alive);
#ifndef CLASK_DISABLE_LOGS
          logger().get(log_level::INFO) << remote << " " << code << " " << req_method << " " << req_path;
#endif
        } catch (std::exception&) {
#ifndef CLASK_DISABLE_LOGS
          logger().get(log_level::WARN) << remote << " " << code << " " << req_method << " " << req_path;
#endif
          std::ostringstream os;
          os << "HTTP/1.0 " << code << " Internal Server Error\r\nContent-Type: text/plain\r\n\r\nInternal Server Error";
          send(s, os.str().data(), (int) os.str().size(), MSG_NOSIGNAL);
        }
      })) {
#ifndef CLASK_DISABLE_LOGS
        logger().get(log_level::WARN) << remote << " " << 404 << " " << req_method << " " << req_path;
#endif
        static const std::string res_content = "HTTP/1.0 404 Not Found\r\nContent-Type: text/plain\r\n\r\nNot Found";
        send(s, res_content.data(), (int) res_content.size(), MSG_NOSIGNAL);
      }

      if (keep_alive)
        goto retry;
      closesocket(s);
    }, s, (std::string) inet_ntoa(address.sin_addr));
    t.detach();
  }
}